

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O1

void libdef_push(BuildCtx *ctx,char *p,int arg)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *__endptr;
  char *pcVar7;
  double dVar8;
  char *ep;
  char *local_20;
  
  if (ctx->mode != BUILD_libdef) {
    return;
  }
  __endptr = p;
  sVar6 = strlen(p);
  iVar5 = (int)sVar6;
  if (*p == '\"') {
    if ((1 < iVar5) && (p[iVar5 - 1U] == '\"')) {
      p[iVar5 - 1U] = '\0';
      libdef_name(p + 1,0xc0);
      return;
    }
    goto LAB_0010bf2b;
  }
  pcVar7 = p;
  if ((byte)(*p - 0x30U) < 10) {
    __endptr = (char *)&local_20;
    dVar8 = strtod(p,(char **)__endptr);
    if (*local_20 != '\0') goto LAB_0010bf2b;
    if (optr + 9 < (uint8_t *)((long)&optr + 1U)) {
      *optr = 0xfb;
      *(double *)(optr + 1) = dVar8;
      optr = optr + 9;
      return;
    }
LAB_0010bf33:
    libdef_push_cold_3();
  }
  else {
    __endptr = "lastcl";
    iVar4 = strcmp(p,"lastcl");
    if (iVar4 == 0) {
      if (optr + 1 < (uint8_t *)((long)&optr + 1U)) {
        puVar2 = optr + 1;
        *optr = 0xfd;
        optr = puVar2;
        return;
      }
      goto LAB_0010bf3d;
    }
    if (iVar5 < 5) {
LAB_0010bf2b:
      libdef_push_cold_4();
      pcVar7 = p;
      goto LAB_0010bf33;
    }
    __endptr = "top-";
    pcVar7 = p;
    iVar5 = strncmp(p,"top-",4);
    puVar2 = optr;
    if (iVar5 != 0) goto LAB_0010bf2b;
    puVar1 = optr + 2;
    if (puVar1 < (uint8_t *)((long)&optr + 1U)) {
      puVar3 = optr + 1;
      *optr = 0xfc;
      optr = puVar3;
      iVar5 = atoi(p + 4);
      optr = puVar1;
      puVar2[1] = (uint8_t)iVar5;
      return;
    }
  }
  libdef_push_cold_1();
LAB_0010bf3d:
  libdef_push_cold_2();
  if (*(int *)(pcVar7 + 8) == 7) {
    if ((*__endptr == '!') && (*(char *)((long)__endptr + 1) == '\0')) {
      *__endptr = 0;
    }
    libdef_name(__endptr,0xc0);
    puVar2 = optr + 1;
    *optr = 0xfa;
    optr = puVar2;
    obuf[2] = obuf[2] + '\x01';
  }
  return;
}

Assistant:

static void libdef_push(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_libdef) {
    int len = (int)strlen(p);
    if (*p == '"') {
      if (len > 1 && p[len-1] == '"') {
	p[len-1] = '\0';
	libdef_name(p+1, LIBINIT_STRING);
	return;
      }
    } else if (*p >= '0' && *p <= '9') {
      char *ep;
      double d = strtod(p, &ep);
      if (*ep == '\0') {
	if (optr+1+sizeof(double) > obuf+sizeof(obuf)) {
	  fprintf(stderr, "Error: output buffer overflow\n");
	  exit(1);
	}
	*optr++ = LIBINIT_NUMBER;
	memcpy_endian(optr, &d, sizeof(double));
	optr += sizeof(double);
	return;
      }
    } else if (!strcmp(p, "lastcl")) {
      if (optr+1 > obuf+sizeof(obuf)) {
	fprintf(stderr, "Error: output buffer overflow\n");
	exit(1);
      }
      *optr++ = LIBINIT_LASTCL;
      return;
    } else if (len > 4 && !strncmp(p, "top-", 4)) {
      if (optr+2 > obuf+sizeof(obuf)) {
	fprintf(stderr, "Error: output buffer overflow\n");
	exit(1);
      }
      *optr++ = LIBINIT_COPY;
      *optr++ = (uint8_t)atoi(p+4);
      return;
    }
    fprintf(stderr, "Error: bad value for %sPUSH(%s)\n", LIBDEF_PREFIX, p);
    exit(1);
  }
}